

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::OperatorResolver::visit(OperatorResolver *this,InPlaceOperator *o)

{
  Op *args_3;
  Context *this_00;
  pool_ref<soul::AST::Expression> *args_1;
  size_t *psVar1;
  int iVar2;
  BinaryOperator *args_2;
  TypeCast *args_2_00;
  char **args;
  pool_ref<soul::AST::Expression> *args_2_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Type destType;
  Type sourceType;
  BinaryOperatorTypes opTypes;
  Type local_148;
  char *local_130;
  Type local_128;
  BinaryOperatorTypes local_110;
  string local_e0;
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,o);
  iVar2 = (*(o->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(o);
  if ((char)iVar2 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    iVar2 = (*(((o->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
    if ((char)iVar2 == '\0') {
      local_110.resultType._0_8_ = BinaryOp::getSymbol(o->operation);
      Errors::operatorNeedsAssignableTarget<char_const*>(&local_68,(Errors *)&local_110,args);
      AST::Context::throwError
                (&(o->super_Expression).super_Statement.super_ASTObject.context,&local_68,false);
    }
    SanityCheckPass::throwErrorIfNotReadableValue((o->source).object);
    (*(((o->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_148);
    (*(((o->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_128);
    BinaryOp::getTypes(&local_110,o->operation,&local_148,&local_128);
    args_3 = &o->operation;
    this_00 = &(o->super_Expression).super_Statement.super_ASTObject.context;
    if ((Errors)local_110.resultType.category == (Errors)0x0) {
      local_130 = BinaryOp::getSymbol(*args_3);
      Type::getDescription_abi_cxx11_(&local_c0,&local_128);
      Type::getDescription_abi_cxx11_(&local_e0,&local_148);
      Errors::illegalTypesForBinaryOperator<char_const*,std::__cxx11::string,std::__cxx11::string>
                (&local_a0,(Errors *)&local_130,(char **)&local_c0,&local_e0,in_R8);
      AST::Context::throwError(this_00,&local_a0,false);
    }
    args_1 = &o->target;
    SanityCheckPass::expectSilentCastPossible
              (this_00,(Type *)((long)&local_110 + 0x18U),args_1->object);
    args_2_01 = &o->source;
    SanityCheckPass::expectSilentCastPossible
              (this_00,(Type *)((long)&local_110 + 0x18U),args_2_01->object);
    args_2 = PoolAllocator::
             allocate<soul::AST::BinaryOperator,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::pool_ref<soul::AST::Expression>&,soul::BinaryOp::Op&>
                       (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,this_00,
                        args_1,args_2_01,args_3);
    if ((((local_148.category & ~primitive) == wrap) && (local_128.primitiveType.type - int32 < 2))
       && (*args_3 < multiply)) {
      args_2_00 = PoolAllocator::
                  allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type&,soul::AST::BinaryOperator&>
                            (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                             &(args_2_01->object->super_Statement).super_ASTObject.context,
                             &local_148,args_2);
      o = (InPlaceOperator *)
          PoolAllocator::
          allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::TypeCast&>
                    (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,this_00,
                     args_1,args_2_00);
    }
    else {
      o = (InPlaceOperator *)
          PoolAllocator::
          allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::BinaryOperator&>
                    (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,this_00,
                     args_1,args_2);
    }
    TypeRules::BinaryOperatorTypes::~BinaryOperatorTypes(&local_110);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_128.structure);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_148.structure);
  }
  return &o->super_Expression;
}

Assistant:

AST::Expression& visit (AST::InPlaceOperator& o) override
        {
            super::visit (o);

            if (! o.isResolved())
            {
                ++numFails;
                return o;
            }

            if (! o.target->isAssignable())
                o.context.throwError (Errors::operatorNeedsAssignableTarget (BinaryOp::getSymbol (o.operation)));

            SanityCheckPass::throwErrorIfNotReadableValue (o.source);

            auto destType    = o.target->getResultType();
            auto sourceType  = o.source->getResultType();

            auto opTypes = BinaryOp::getTypes (o.operation, destType, sourceType);

            if (! opTypes.resultType.isValid())
                o.context.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (o.operation),
                                                                             sourceType.getDescription(),
                                                                             destType.getDescription()));

            SanityCheckPass::expectSilentCastPossible (o.context, opTypes.operandType, o.target);
            SanityCheckPass::expectSilentCastPossible (o.context, opTypes.operandType, o.source);

            auto& binaryOp = allocator.allocate<AST::BinaryOperator> (o.context, o.target, o.source, o.operation);

            // special-case handling for addition of an int to a wrap or clamp type, as we want this to
            // work without the user needing to write it out long-hand with a cast
            if (destType.isBoundedInt() && sourceType.isInteger()
                 && (o.operation == BinaryOp::Op::add || o.operation == BinaryOp::Op::subtract))
            {
                auto& resultCast = allocator.allocate<AST::TypeCast> (o.source->context, destType, binaryOp);
                return allocator.allocate<AST::Assignment> (o.context, o.target, resultCast);
            }

            return allocator.allocate<AST::Assignment> (o.context, o.target, binaryOp);
        }